

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_free.c
# Opt level: O0

void lyd_free_(lyd_node *node)

{
  lysc_node *local_48;
  ly_ctx *local_38;
  lyd_node *local_28;
  lyd_node *first_sibling;
  lyd_node *next;
  lyd_node *iter;
  lyd_node *node_local;
  
  local_28 = (lyd_node *)0x0;
  if (node != (lyd_node *)0x0) {
    iter = node;
    next = lyd_first_sibling(node);
    while (next != (lyd_node *)0x0) {
      first_sibling = next->next;
      if ((((next->schema != (lysc_node *)0x0) && (next->schema->nodetype == 4)) &&
          ((next->schema->flags & 0x100) != 0)) && (next->parent != (lyd_node_inner *)0x0)) {
        if (next->schema == (lysc_node *)0x0) {
          local_38 = (ly_ctx *)next[2].schema;
        }
        else {
          local_38 = next->schema->module->ctx;
        }
        if (next->schema == (lysc_node *)0x0) {
          local_48 = next[1].schema;
        }
        else {
          local_48 = (lysc_node *)next->schema->name;
        }
        ly_log(local_38,LY_LLERR,LY_EINVAL,
               "Cannot free a list key \"%s\", free the list instance instead.",local_48);
        return;
      }
      if (next->parent != (lyd_node_inner *)0x0) {
        lyds_free_metadata(next);
        lyd_unlink_ignore_lyds(&local_28,next);
      }
      lyd_free_subtree(next);
      next = first_sibling;
    }
  }
  return;
}

Assistant:

static void
lyd_free_(struct lyd_node *node)
{
    struct lyd_node *iter, *next, *first_sibling = NULL;

    if (!node) {
        return;
    }

    LY_LIST_FOR_SAFE(lyd_first_sibling(node), next, iter) {
        if (lysc_is_key(iter->schema) && iter->parent) {
            LOGERR(LYD_CTX(iter), LY_EINVAL, "Cannot free a list key \"%s\", free the list instance instead.", LYD_NAME(iter));
            return;
        }

        /* in case of the top-level nodes (node->parent is NULL), no unlinking needed */
        if (iter->parent) {
            lyds_free_metadata(iter);
            lyd_unlink_ignore_lyds(&first_sibling, iter);
        }
        lyd_free_subtree(iter);
    }
}